

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O2

void CheckApplyEnclosesArgs
               (ParseNode *pnode,ByteCodeGenerator *byteCodeGenerator,ApplyCheck *applyCheck)

{
  bool bVar1;
  ParseNodeName *pPVar2;
  ParseNodeCall *pPVar3;
  
  if (pnode == (ParseNode *)0x0) {
    return;
  }
  if (applyCheck->matches != true) {
    return;
  }
  if (pnode->nop == knopCall) {
    if ((pnode->field_0x1 & 1) != 0) {
      return;
    }
    pPVar3 = ParseNode::AsParseNodeCall(pnode);
    bVar1 = IsApplyArgs(pPVar3);
    if (!bVar1) {
      return;
    }
    if (applyCheck->insideApplyCall != true) {
      applyCheck->insideApplyCall = true;
      applyCheck->sawApply = true;
      pPVar3 = ParseNode::AsParseNodeCall(pnode);
      pPVar3->field_0x24 = pPVar3->field_0x24 | 2;
      return;
    }
  }
  else {
    if (pnode->nop != knopName) {
      return;
    }
    pPVar2 = ParseNode::AsParseNodeName(pnode);
    if (pPVar2->sym == (Symbol *)0x0) {
      return;
    }
    bVar1 = Symbol::IsArguments(pPVar2->sym);
    if (!bVar1) {
      return;
    }
    if (applyCheck->insideApplyCall != false) {
      return;
    }
  }
  applyCheck->matches = false;
  return;
}

Assistant:

void CheckApplyEnclosesArgs(ParseNode* pnode, ByteCodeGenerator* byteCodeGenerator, ApplyCheck* applyCheck)
{
    if ((pnode == nullptr) || (!applyCheck->matches))
    {
        return;
    }

    switch (pnode->nop)
    {
    case knopName:
    {
        Symbol* sym = pnode->AsParseNodeName()->sym;
        if (sym != nullptr)
        {
            if (sym->IsArguments())
            {
                if (!applyCheck->insideApplyCall)
                {
                    applyCheck->matches = false;
                }
            }
        }
        break;
    }

    case knopCall:
        if ((!pnode->isUsed) && IsApplyArgs(pnode->AsParseNodeCall()))
        {
            // no nested apply calls
            if (applyCheck->insideApplyCall)
            {
                applyCheck->matches = false;
            }
            else
            {
                applyCheck->insideApplyCall = true;
                applyCheck->sawApply = true;
                pnode->AsParseNodeCall()->isApplyCall = true;
            }
        }
        break;
    }
}